

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O0

void __thiscall OpenMD::Rattle::doConstraint(Rattle *this,ConstraintPairFuncPtr func)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long in_RDX;
  iterator *in_RSI;
  long in_RDI;
  int exeStatus;
  int iteration;
  int done;
  ConstraintPairIterator cpi;
  ConstraintPair *consPair;
  ConstraintElemIterator cei;
  ConstraintElem *consElem;
  MoleculeIterator mi;
  Molecule *mol;
  undefined1 in_stack_ffffffffffffff5f;
  ConstraintPair *in_stack_ffffffffffffff60;
  iterator *local_90;
  iterator *in_stack_ffffffffffffff78;
  SimInfo *in_stack_ffffffffffffff80;
  uint local_60;
  __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
  local_58;
  ConstraintPair *local_50;
  __normal_iterator<OpenMD::ConstraintElem_**,_std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>_>
  local_48;
  ConstraintPair *local_40;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_38;
  Molecule *local_30;
  iterator *local_28;
  long local_20;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    local_28 = in_RSI;
    local_20 = in_RDX;
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_38);
    __gnu_cxx::
    __normal_iterator<OpenMD::ConstraintElem_**,_std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>_>
    ::__normal_iterator(&local_48);
    __gnu_cxx::
    __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
    ::__normal_iterator(&local_58);
    local_30 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78);
    while (local_30 != (Molecule *)0x0) {
      local_40 = (ConstraintPair *)
                 Molecule::beginConstraintElem
                           ((Molecule *)in_stack_ffffffffffffff80,
                            (iterator *)in_stack_ffffffffffffff78);
      while (local_40 != (ConstraintPair *)0x0) {
        ConstraintElem::setMoved
                  ((ConstraintElem *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
        ConstraintElem::setMoving
                  ((ConstraintElem *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
        local_40 = (ConstraintPair *)
                   Molecule::nextConstraintElem
                             ((Molecule *)in_stack_ffffffffffffff80,
                              (iterator *)in_stack_ffffffffffffff78);
      }
      local_50 = Molecule::beginConstraintPair
                           ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      while (local_50 != (ConstraintPair *)0x0) {
        ConstraintPair::resetConstraintForce(local_50);
        local_50 = Molecule::nextConstraintPair
                             ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      local_30 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78)
      ;
    }
    bVar1 = false;
    local_60 = 0;
    while( true ) {
      bVar2 = false;
      if (!bVar1) {
        bVar2 = (int)local_60 < *(int *)(in_RDI + 8);
      }
      if (!bVar2) break;
      bVar1 = true;
      local_30 = SimInfo::beginMolecule
                           (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78)
      ;
      while (local_30 != (Molecule *)0x0) {
        local_50 = Molecule::beginConstraintPair
                             ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        while (local_50 != (ConstraintPair *)0x0) {
          bVar2 = ConstraintPair::isMoved(in_stack_ffffffffffffff60);
          if (bVar2) {
            in_stack_ffffffffffffff80 = (SimInfo *)(in_RDI + local_20);
            if (((ulong)local_28 & 1) == 0) {
              local_90 = local_28;
            }
            else {
              local_90 = *(iterator **)
                          ((long)local_28 + (long)in_stack_ffffffffffffff80->_vptr_SimInfo + -1);
            }
            in_stack_ffffffffffffff78 = local_28;
            iVar3 = (*(code *)local_90)(in_stack_ffffffffffffff80,local_50);
            if (iVar3 == -1) {
              snprintf(painCave.errMsg,2000,
                       "Constraint failure in Rattle::constrainA, Constraint Fail\n");
              painCave.isFatal = 1;
              simError();
            }
            else if (iVar3 == 0) {
              bVar1 = false;
              ConstraintPair::getConsElem1(local_50);
              ConstraintElem::setMoving
                        ((ConstraintElem *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f
                        );
              ConstraintPair::getConsElem2(local_50);
              ConstraintElem::setMoving
                        ((ConstraintElem *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f
                        );
            }
            else if (iVar3 != 1) {
              snprintf(painCave.errMsg,2000,
                       "ConstraintAlgorithm::doConstraint() Error: unrecognized status");
              painCave.isFatal = 1;
              simError();
            }
          }
          local_50 = Molecule::nextConstraintPair
                               ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
        local_30 = SimInfo::nextMolecule
                             (in_stack_ffffffffffffff80,
                              (MoleculeIterator *)in_stack_ffffffffffffff78);
      }
      errorCheckPoint();
      local_30 = SimInfo::beginMolecule
                           (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78)
      ;
      while (local_30 != (Molecule *)0x0) {
        local_40 = (ConstraintPair *)
                   Molecule::beginConstraintElem
                             ((Molecule *)in_stack_ffffffffffffff80,
                              (iterator *)in_stack_ffffffffffffff78);
        while (local_40 != (ConstraintPair *)0x0) {
          in_stack_ffffffffffffff60 = local_40;
          ConstraintElem::getMoving((ConstraintElem *)0x3255a4);
          ConstraintElem::setMoved
                    ((ConstraintElem *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
          ConstraintElem::setMoving
                    ((ConstraintElem *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
          local_40 = (ConstraintPair *)
                     Molecule::nextConstraintElem
                               ((Molecule *)in_stack_ffffffffffffff80,
                                (iterator *)in_stack_ffffffffffffff78);
        }
        local_30 = SimInfo::nextMolecule
                             (in_stack_ffffffffffffff80,
                              (MoleculeIterator *)in_stack_ffffffffffffff78);
      }
      local_60 = local_60 + 1;
    }
    if (!bVar1) {
      snprintf(painCave.errMsg,2000,
               "Constraint failure in Rattle::constrainA, too many iterations: %d\n",(ulong)local_60
              );
      painCave.isFatal = 1;
      simError();
    }
    errorCheckPoint();
  }
  return;
}

Assistant:

void Rattle::doConstraint(ConstraintPairFuncPtr func) {
    if (!doRattle_) return;

    Molecule* mol;
    SimInfo::MoleculeIterator mi;
    ConstraintElem* consElem;
    Molecule::ConstraintElemIterator cei;
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (consElem = mol->beginConstraintElem(cei); consElem != NULL;
           consElem = mol->nextConstraintElem(cei)) {
        consElem->setMoved(true);
        consElem->setMoving(false);
      }
      for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
           consPair = mol->nextConstraintPair(cpi)) {
        consPair->resetConstraintForce();
      }
    }

    // main loop of constraint algorithm
    int done      = 0;
    int iteration = 0;
    while (!done && iteration < maxConsIteration_) {
      done = 1;

      // loop over every constraint pair

      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          // dispatch constraint algorithm
          if (consPair->isMoved()) {
            int exeStatus = (this->*func)(consPair);

            switch (exeStatus) {
            case consFail:
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "Constraint failure in Rattle::constrainA, "
                       "Constraint Fail\n");
              painCave.isFatal = 1;
              simError();

              break;
            case consSuccess:
              // constrain the pair by moving two elements
              done = 0;
              consPair->getConsElem1()->setMoving(true);
              consPair->getConsElem2()->setMoving(true);
              break;
            case consAlready:
              // current pair is already constrained, do not need to
              // move the elements
              break;
            default:
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ConstraintAlgorithm::doConstraint() "
                       "Error: unrecognized status");
              painCave.isFatal = 1;
              simError();
              break;
            }
          }
        }
      }  // end for(iter->first())

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &done, 1, MPI_INT, MPI_LAND, MPI_COMM_WORLD);
#endif

      errorCheckPoint();

      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consElem = mol->beginConstraintElem(cei); consElem != NULL;
             consElem = mol->nextConstraintElem(cei)) {
          consElem->setMoved(consElem->getMoving());
          consElem->setMoving(false);
        }
      }
      iteration++;
    }  // end while

    if (!done) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Constraint failure in Rattle::constrainA, "
               "too many iterations: %d\n",
               iteration);
      painCave.isFatal = 1;
      simError();
    }

    errorCheckPoint();
  }